

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpStateVarRequest.c
# Opt level: O0

int UpnpStateVarRequest_assign(UpnpStateVarRequest *p,UpnpStateVarRequest *q)

{
  int iVar1;
  UpnpString *pUVar2;
  sockaddr_storage *buf;
  char *s;
  bool bVar3;
  bool bVar4;
  undefined1 local_89;
  undefined4 local_1c;
  int ok;
  UpnpStateVarRequest *q_local;
  UpnpStateVarRequest *p_local;
  
  local_1c = 1;
  if (p != q) {
    iVar1 = UpnpStateVarRequest_get_ErrCode(q);
    iVar1 = UpnpStateVarRequest_set_ErrCode(p,iVar1);
    bVar3 = false;
    if (iVar1 != 0) {
      iVar1 = UpnpStateVarRequest_get_Socket(q);
      iVar1 = UpnpStateVarRequest_set_Socket(p,iVar1);
      bVar3 = iVar1 != 0;
    }
    bVar4 = false;
    if (bVar3) {
      pUVar2 = UpnpStateVarRequest_get_ErrStr(q);
      iVar1 = UpnpStateVarRequest_set_ErrStr(p,pUVar2);
      bVar4 = iVar1 != 0;
    }
    bVar3 = false;
    if (bVar4) {
      pUVar2 = UpnpStateVarRequest_get_DevUDN(q);
      iVar1 = UpnpStateVarRequest_set_DevUDN(p,pUVar2);
      bVar3 = iVar1 != 0;
    }
    bVar4 = false;
    if (bVar3) {
      pUVar2 = UpnpStateVarRequest_get_ServiceID(q);
      iVar1 = UpnpStateVarRequest_set_ServiceID(p,pUVar2);
      bVar4 = iVar1 != 0;
    }
    bVar3 = false;
    if (bVar4) {
      pUVar2 = UpnpStateVarRequest_get_StateVarName(q);
      iVar1 = UpnpStateVarRequest_set_StateVarName(p,pUVar2);
      bVar3 = iVar1 != 0;
    }
    bVar4 = false;
    if (bVar3) {
      buf = UpnpStateVarRequest_get_CtrlPtIPAddr(q);
      iVar1 = UpnpStateVarRequest_set_CtrlPtIPAddr(p,buf);
      bVar4 = iVar1 != 0;
    }
    local_89 = false;
    if (bVar4) {
      s = UpnpStateVarRequest_get_CurrentVal(q);
      iVar1 = UpnpStateVarRequest_set_CurrentVal(p,s);
      local_89 = iVar1 != 0;
    }
    local_1c = (uint)local_89;
  }
  return local_1c;
}

Assistant:

int UpnpStateVarRequest_assign(
	UpnpStateVarRequest *p, const UpnpStateVarRequest *q)
{
	int ok = 1;

	if (p != q) {
		ok = ok && UpnpStateVarRequest_set_ErrCode(
				   p, UpnpStateVarRequest_get_ErrCode(q));
		ok = ok && UpnpStateVarRequest_set_Socket(
				   p, UpnpStateVarRequest_get_Socket(q));
		ok = ok && UpnpStateVarRequest_set_ErrStr(
				   p, UpnpStateVarRequest_get_ErrStr(q));
		ok = ok && UpnpStateVarRequest_set_DevUDN(
				   p, UpnpStateVarRequest_get_DevUDN(q));
		ok = ok && UpnpStateVarRequest_set_ServiceID(
				   p, UpnpStateVarRequest_get_ServiceID(q));
		ok = ok && UpnpStateVarRequest_set_StateVarName(
				   p, UpnpStateVarRequest_get_StateVarName(q));
		ok = ok && UpnpStateVarRequest_set_CtrlPtIPAddr(
				   p, UpnpStateVarRequest_get_CtrlPtIPAddr(q));
		ok = ok && UpnpStateVarRequest_set_CurrentVal(
				   p, UpnpStateVarRequest_get_CurrentVal(q));
	}

	return ok;
}